

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

bool __thiscall
despot::util::tinyxml::TiXmlDocument::Accept(TiXmlDocument *this,TiXmlVisitor *visitor)

{
  byte bVar1;
  undefined1 uVar2;
  int iVar3;
  TiXmlNode *pTVar4;
  
  bVar1 = (**(code **)(*(long *)visitor + 0x10))(visitor,this);
  pTVar4 = (this->super_TiXmlNode).firstChild;
  if ((pTVar4 != (TiXmlNode *)0x0 & bVar1) == 1) {
    do {
      iVar3 = (*(pTVar4->super_TiXmlBase)._vptr_TiXmlBase[0x11])(pTVar4,visitor);
      if ((char)iVar3 == '\0') break;
      pTVar4 = pTVar4->next;
    } while (pTVar4 != (TiXmlNode *)0x0);
  }
  uVar2 = (**(code **)(*(long *)visitor + 0x18))(visitor,this);
  return (bool)uVar2;
}

Assistant:

bool TiXmlDocument::Accept(TiXmlVisitor* visitor) const {
	if (visitor->VisitEnter(*this)) {
		for (const TiXmlNode* node = FirstChild(); node;
			node = node->NextSibling()) {
			if (!node->Accept(visitor))
				break;
		}
	}
	return visitor->VisitExit(*this);
}